

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Value * __thiscall flow::IRBuilder::createSLen(IRBuilder *this,Value *value,string *name)

{
  long lVar1;
  UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *unaff_R12;
  string local_58;
  Value *local_38;
  size_type local_30;
  
  local_38 = value;
  if (value == (Value *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = __dynamic_cast(value,&Value::typeinfo,
                           &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
  }
  if (lVar1 != 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,*(long *)(lVar1 + 0x48),
               *(long *)(lVar1 + 0x50) + *(long *)(lVar1 + 0x48));
    local_30 = local_58._M_string_length;
    unaff_R12 = (UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *)
                IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                          (this->program_,&this->program_->numbers_,(long *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (lVar1 == 0) {
    makeName(&local_58,this,name);
    unaff_R12 = insert<flow::UnaryInstr<(flow::UnaryOperator)3,(flow::LiteralType)2>,flow::Value*&,std::__cxx11::string>
                          (this,&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return (Value *)unaff_R12;
}

Assistant:

Value* IRBuilder::createSLen(Value* value, const std::string& name) {
  if (auto a = dynamic_cast<ConstantString*>(value))
    return get(a->get().size());

  return insert<SLenInstr>(value, makeName(name));
}